

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O3

void Ivy_ManTestCutsAll(Ivy_Man_t *p)

{
  Ivy_Obj_t *pObj;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int level;
  uint uVar6;
  long lVar7;
  uint uVar8;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  iVar1 = p->nObjs[5];
  iVar3 = p->nObjs[6];
  uVar5 = -(iVar1 + iVar3);
  pVVar2 = p->vObjs;
  if (pVVar2->nSize < 1) {
    uVar8 = 0;
    uVar6 = 0;
  }
  else {
    lVar7 = 0;
    uVar6 = 0;
    uVar8 = 0;
    do {
      pObj = (Ivy_Obj_t *)pVVar2->pArray[lVar7];
      if ((pObj != (Ivy_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x8 & 0xf) - 7)) {
        Ivy_NodeFindCutsAll(p,pObj,5);
        uVar5 = uVar5 + Ivy_NodeFindCutsAll::CutStore.nCuts;
        uVar6 = uVar6 + (Ivy_NodeFindCutsAll::CutStore.nCuts == 0x100);
        uVar8 = uVar8 + 1;
        pVVar2 = p->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar2->nSize);
    iVar1 = p->nObjs[5];
    iVar3 = p->nObjs[6];
  }
  level = 0xac8880;
  printf("Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ",(ulong)uVar5,
         (ulong)(uint)(iVar1 + p->nObjs[1] + iVar3),(ulong)uVar8,(ulong)uVar6);
  Abc_Print(level,"%s =","Time");
  iVar3 = 3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar7 + lVar4) / 1000000.0);
  return;
}

Assistant:

void Ivy_ManTestCutsAll( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i, nCutsCut, nCutsTotal, nNodeTotal, nNodeOver;
    abctime clk = Abc_Clock();
    nNodeTotal = nNodeOver = 0;
    nCutsTotal = -Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( !Ivy_ObjIsNode(pObj) )
            continue;
        nCutsCut    = Ivy_NodeFindCutsAll( p, pObj, 5 )->nCuts;
        nCutsTotal += nCutsCut;
        nNodeOver  += (nCutsCut == IVY_CUT_LIMIT);
        nNodeTotal++;
    }
    printf( "Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ", 
        nCutsTotal, Ivy_ManPiNum(p) + Ivy_ManNodeNum(p), nNodeTotal, nNodeOver );
    ABC_PRT( "Time", Abc_Clock() - clk );
}